

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

TIntermAggregate * __thiscall
glslang::TParseContext::handleFunctionDefinition
          (TParseContext *this,TSourceLoc *loc,TFunction *function)

{
  int *piVar1;
  TSymbolTable *this_00;
  char *__s;
  char *pcVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TSymbol *pTVar5;
  long *plVar6;
  undefined4 extraout_var_02;
  TType *this_01;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  TPoolAllocator *pTVar7;
  TIntermAggregate *this_02;
  undefined4 extraout_var_09;
  TVariable *this_03;
  TIntermSymbol *right;
  undefined4 extraout_var_10;
  TIntermediate *pTVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  undefined1 local_c8 [152];
  undefined4 extraout_var_01;
  
  iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[6])(function);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  _M_assign(&this->currentCaller,
            (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
            CONCAT44(extraout_var,iVar4));
  this_00 = (this->super_TParseContextBase).symbolTable;
  iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[6])(function);
  plVar6 = (long *)0x0;
  pTVar5 = TSymbolTable::find(this_00,(TString *)CONCAT44(extraout_var_00,iVar4),(bool *)0x0,
                              (bool *)0x0,(int *)0x0);
  if (pTVar5 != (TSymbol *)0x0) {
    iVar4 = (*pTVar5->_vptr_TSymbol[7])(pTVar5);
    plVar6 = (long *)CONCAT44(extraout_var_01,iVar4);
  }
  if (plVar6 == (long *)0x0) {
    iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can\'t find function",*(undefined8 *)(CONCAT44(extraout_var_03,iVar4) + 8))
    ;
  }
  else {
    cVar3 = (**(code **)(*plVar6 + 0xe8))(plVar6);
    if (cVar3 != '\0') {
      iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"function already has a body",
                 *(undefined8 *)(CONCAT44(extraout_var_02,iVar4) + 8));
    }
    cVar3 = (**(code **)(*plVar6 + 0xe8))(plVar6);
    if (cVar3 == '\0') {
      (**(code **)(*plVar6 + 0xe0))(plVar6);
      this_01 = (TType *)(**(code **)(*plVar6 + 0x60))(plVar6);
      goto LAB_0041fe22;
    }
  }
  pTVar7 = GetThreadPoolAllocator();
  this_01 = (TType *)TPoolAllocator::allocate(pTVar7,0x98);
  TType::TType(this_01,EbtVoid,EvqTemporary,1,0,0,false);
LAB_0041fe22:
  (this->super_TParseContextBase).currentFunctionType = this_01;
  (this->super_TParseContextBase).functionReturnsValue = false;
  iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  CONCAT44(extraout_var_04,iVar4),
                  (((this->super_TParseContextBase).super_TParseVersions.intermediate)->
                  entryPointName)._M_dataplus._M_p);
  bVar11 = iVar4 == 0;
  if (bVar11) {
    pTVar8 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[6])(function);
    __s = *(char **)(CONCAT44(extraout_var_05,iVar4) + 8);
    pcVar2 = (char *)(pTVar8->entryPointMangledName)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&pTVar8->entryPointMangledName,0,pcVar2,(ulong)__s);
    piVar1 = &((this->super_TParseContextBase).super_TParseVersions.intermediate)->numEntryPoints;
    *piVar1 = *piVar1 + 1;
  }
  this->inMain = bVar11;
  if (bVar11) {
    iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    if (0 < iVar4) {
      iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"function cannot take any parameter(s)",
                 *(undefined8 *)(CONCAT44(extraout_var_06,iVar4) + 8));
    }
    iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
    iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar4) + 0x38))
                      ((long *)CONCAT44(extraout_var_07,iVar4));
    if (iVar4 != 0) {
      iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
      TType::getBasicTypeString_abi_cxx11_
                ((TString *)local_c8,(TType *)CONCAT44(extraout_var_08,iVar4));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"",local_c8._8_8_);
    }
    if (function->linkType != ELinkNone) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"main function cannot be exported");
    }
  }
  TSymbolTable::push((this->super_TParseContextBase).symbolTable);
  pTVar7 = GetThreadPoolAllocator();
  this_02 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar7,0x188);
  TIntermAggregate::TIntermAggregate(this_02);
  iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
  if (0 < iVar4) {
    uVar10 = 0;
    do {
      iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,uVar10);
      plVar6 = (long *)CONCAT44(extraout_var_09,iVar4);
      if (*plVar6 == 0) {
        pTVar8 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        right = TIntermediate::addSymbol(pTVar8,(TType *)plVar6[1],loc);
LAB_00420049:
        this_02 = TIntermediate::growAggregate
                            (pTVar8,(TIntermNode *)this_02,(TIntermNode *)right,loc);
      }
      else {
        pTVar7 = GetThreadPoolAllocator();
        this_03 = (TVariable *)TPoolAllocator::allocate(pTVar7,0xf8);
        TVariable::TVariable(this_03,(TString *)*plVar6,(TString *)*plVar6,(TType *)plVar6[1],false)
        ;
        bVar11 = TSymbolTable::insert
                           ((this->super_TParseContextBase).symbolTable,(TSymbol *)this_03);
        if (bVar11) {
          *plVar6 = 0;
          pTVar8 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          right = TIntermediate::addSymbol(pTVar8,this_03,loc);
          goto LAB_00420049;
        }
        iVar4 = (*(this_03->super_TSymbol)._vptr_TSymbol[3])(this_03);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"redefinition",*(undefined8 *)(CONCAT44(extraout_var_10,iVar4) + 8));
      }
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
      iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    } while ((int)uVar9 < iVar4);
  }
  this_02->linkType = function->linkType;
  pTVar8 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  TType::TType((TType *)local_c8,EbtVoid,EvqTemporary,1,0,0,false);
  TIntermediate::setAggregateOperator
            (pTVar8,(TIntermNode *)this_02,EOpParameters,(TType *)local_c8,loc);
  (this->super_TParseContextBase).statementNestingLevel = 0;
  (this->super_TParseContextBase).loopNestingLevel = 0;
  (this->super_TParseContextBase).controlFlowNestingLevel = 0;
  (this->super_TParseContextBase).postEntryPointReturn = false;
  return this_02;
}

Assistant:

TIntermAggregate* TParseContext::handleFunctionDefinition(const TSourceLoc& loc, TFunction& function)
{
    currentCaller = function.getMangledName();
    TSymbol* symbol = symbolTable.find(function.getMangledName());
    TFunction* prevDec = symbol ? symbol->getAsFunction() : nullptr;

    if (! prevDec)
        error(loc, "can't find function", function.getName().c_str(), "");
    // Note:  'prevDec' could be 'function' if this is the first time we've seen function
    // as it would have just been put in the symbol table.  Otherwise, we're looking up
    // an earlier occurrence.

    if (prevDec && prevDec->isDefined()) {
        // Then this function already has a body.
        error(loc, "function already has a body", function.getName().c_str(), "");
    }
    if (prevDec && ! prevDec->isDefined()) {
        prevDec->setDefined();

        // Remember the return type for later checking for RETURN statements.
        currentFunctionType = &(prevDec->getType());
    } else
        currentFunctionType = new TType(EbtVoid);
    functionReturnsValue = false;

    // Check for entry point
    if (function.getName().compare(intermediate.getEntryPointName().c_str()) == 0) {
        intermediate.setEntryPointMangledName(function.getMangledName().c_str());
        intermediate.incrementEntryPointCount();
        inMain = true;
    } else
        inMain = false;

    //
    // Raise error message if main function takes any parameters or returns anything other than void
    //
    if (inMain) {
        if (function.getParamCount() > 0)
            error(loc, "function cannot take any parameter(s)", function.getName().c_str(), "");
        if (function.getType().getBasicType() != EbtVoid)
            error(loc, "", function.getType().getBasicTypeString().c_str(), "entry point cannot return a value");
        if (function.getLinkType() != ELinkNone)
            error(loc, "main function cannot be exported", "", "");
    }

    //
    // New symbol table scope for body of function plus its arguments
    //
    symbolTable.push();

    //
    // Insert parameters into the symbol table.
    // If the parameter has no name, it's not an error, just don't insert it
    // (could be used for unused args).
    //
    // Also, accumulate the list of parameters into the HIL, so lower level code
    // knows where to find parameters.
    //
    TIntermAggregate* paramNodes = new TIntermAggregate;
    for (int i = 0; i < function.getParamCount(); i++) {
        TParameter& param = function[i];
        if (param.name != nullptr) {
            TVariable *variable = new TVariable(param.name, *param.type);

            // Insert the parameters with name in the symbol table.
            if (! symbolTable.insert(*variable))
                error(loc, "redefinition", variable->getName().c_str(), "");
            else {
                // Transfer ownership of name pointer to symbol table.
                param.name = nullptr;

                // Add the parameter to the HIL
                paramNodes = intermediate.growAggregate(paramNodes,
                                                        intermediate.addSymbol(*variable, loc),
                                                        loc);
            }
        } else
            paramNodes = intermediate.growAggregate(paramNodes, intermediate.addSymbol(*param.type, loc), loc);
    }
    paramNodes->setLinkType(function.getLinkType());
    intermediate.setAggregateOperator(paramNodes, EOpParameters, TType(EbtVoid), loc);
    loopNestingLevel = 0;
    statementNestingLevel = 0;
    controlFlowNestingLevel = 0;
    postEntryPointReturn = false;

    return paramNodes;
}